

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac_seek_to_pcm_frame(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  ma_dr_flac_bs *bs;
  ulong pcmFrameIndex_00;
  ma_dr_flac_oggbs *oggbs;
  bool bVar1;
  ma_uint32 mVar2;
  uint uVar3;
  ma_bool32 mVar4;
  ma_result mVar5;
  ma_bool32 mVar6;
  ma_uint64 mVar7;
  ma_uint64 mVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ma_bool32 unaff_R14D;
  int iVar14;
  
  bVar1 = false;
  bs = &pFlac->bs;
LAB_0016dea7:
  if (pFlac != (ma_dr_flac *)0x0) {
    pcmFrameIndex_00 = pFlac->currentPCMFrame;
    mVar4 = 1;
    if (pcmFrameIndex_00 == pcmFrameIndex) goto LAB_0016e23a;
    mVar7 = pFlac->firstFLACFramePosInBytes;
    if (mVar7 != 0) {
      if (pcmFrameIndex == 0) {
        pFlac->currentPCMFrame = 0;
        mVar4 = ma_dr_flac__seek_to_byte(bs,mVar7);
        memset(&pFlac->currentFLACFrame,0,0xa8);
      }
      else {
        if (pFlac->totalPCMFrameCount < pcmFrameIndex) {
          pcmFrameIndex = pFlac->totalPCMFrameCount;
        }
        if (pcmFrameIndex <= pcmFrameIndex_00) {
          uVar3 = (int)pcmFrameIndex_00 - (int)pcmFrameIndex;
          mVar2 = (pFlac->currentFLACFrame).pcmFramesRemaining;
          if (uVar3 < (pFlac->currentFLACFrame).header.blockSizeInPCMFrames - mVar2) {
            (pFlac->currentFLACFrame).pcmFramesRemaining = mVar2 + uVar3;
            goto LAB_0016e233;
          }
LAB_0016df15:
          if (pFlac->container == ma_dr_flac_container_ogg) {
            oggbs = (ma_dr_flac_oggbs *)pFlac->_oggbs;
            mVar8 = oggbs->currentBytePos;
            mVar4 = ma_dr_flac__seek_to_byte(bs,mVar7);
            if (mVar4 == 0) {
              mVar4 = 0;
            }
            else {
              oggbs->bytesRemainingInPage = 0;
              mVar4 = ma_dr_flac_oggbs__goto_next_page(oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch)
              ;
              if (mVar4 != 0) {
                uVar12 = 0;
                do {
                  uVar13 = (oggbs->currentPageHeader).granulePosition;
                  if (pcmFrameIndex <= uVar13) {
                    mVar4 = 0;
                    mVar6 = ma_dr_flac_oggbs__seek_physical
                                      (oggbs,(oggbs->currentBytePos -
                                             ((ulong)oggbs->pageDataSize +
                                             (ulong)(oggbs->currentPageHeader).segmentCount)) - 0x1b
                                       ,ma_dr_flac_seek_origin_start);
                    if (mVar6 == 0) goto LAB_0016e1be;
                    mVar4 = 0;
                    mVar6 = ma_dr_flac_oggbs__goto_next_page
                                      (oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch);
                    if (mVar6 == 0) goto LAB_0016e1be;
                    goto LAB_0016e09e;
                  }
                  if ((((oggbs->currentPageHeader).headerType & 1) == 0) &&
                     (((1 < (oggbs->currentPageHeader).segmentTable[0] &&
                       (oggbs->pageData[0] == 0xff)) && ((oggbs->pageData[1] & 0xfc) == 0xf8)))) {
                    uVar12 = uVar13;
                  }
                  mVar4 = ma_dr_flac_oggbs__goto_next_page
                                    (oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch);
                } while (mVar4 != 0);
              }
              mVar4 = 0;
              ma_dr_flac_oggbs__seek_physical(oggbs,mVar8,ma_dr_flac_seek_origin_start);
            }
          }
          else {
            if ((pFlac->field_0x128 & 1) == 0) {
              mVar6 = ma_dr_flac__seek_to_pcm_frame__seek_table(pFlac,pcmFrameIndex);
              mVar4 = 1;
              if (mVar6 != 0) goto LAB_0016e1be;
            }
            if (((pFlac->field_0x128 & 2) == 0) && (pFlac->totalPCMFrameCount != 0)) {
              mVar6 = ma_dr_flac__seek_to_pcm_frame__binary_search(pFlac,pcmFrameIndex);
              mVar4 = 1;
              if (mVar6 != 0) goto LAB_0016e1be;
            }
            if ((pFlac->field_0x128 & 4) == 0) {
              mVar4 = ma_dr_flac__seek_to_pcm_frame__brute_force(pFlac,pcmFrameIndex);
            }
            else {
              mVar4 = 0;
            }
          }
          goto LAB_0016e1be;
        }
        uVar9 = (int)pcmFrameIndex - (int)pcmFrameIndex_00;
        uVar3 = (pFlac->currentFLACFrame).pcmFramesRemaining;
        mVar2 = uVar3 - uVar9;
        if (uVar3 < uVar9 || mVar2 == 0) goto LAB_0016df15;
        (pFlac->currentFLACFrame).pcmFramesRemaining = mVar2;
LAB_0016e233:
        pFlac->currentPCMFrame = pcmFrameIndex;
      }
      goto LAB_0016e23a;
    }
  }
  mVar4 = 0;
LAB_0016e23a:
  if (bVar1) {
    mVar4 = unaff_R14D;
  }
  return mVar4;
  while ((iVar14 == 0 || (iVar14 == 5))) {
LAB_0016e09e:
    mVar6 = ma_dr_flac__read_next_flac_frame_header
                      (bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
    iVar14 = 1;
    if (mVar6 == 0) {
      mVar4 = 0;
      iVar14 = 1;
    }
    else {
      mVar7 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
      if (mVar7 == 0) {
        mVar7 = (ulong)pFlac->maxBlockSizeInPCMFrames *
                (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
      }
      lVar10 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar7;
      lVar11 = 0;
      if (lVar10 != 0) {
        lVar11 = lVar10 + -1;
      }
      uVar13 = (uVar12 - mVar7) + lVar11 + 1;
      if ((pFlac->totalPCMFrameCount == pcmFrameIndex) && (uVar13 == pFlac->totalPCMFrameCount)) {
        mVar5 = ma_dr_flac__decode_flac_frame(pFlac);
        if (mVar5 == MA_SUCCESS) {
          pFlac->currentPCMFrame = pcmFrameIndex;
          (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
          iVar14 = 1;
          mVar4 = 1;
        }
        else {
LAB_0016e16f:
          mVar4 = 0;
        }
      }
      else if (pcmFrameIndex < uVar13) {
        mVar5 = ma_dr_flac__decode_flac_frame(pFlac);
        if (mVar5 == MA_CRC_MISMATCH) {
LAB_0016e167:
          iVar14 = 5;
        }
        else if (mVar5 == MA_SUCCESS) {
          mVar7 = pcmFrameIndex - uVar12;
          iVar14 = 1;
          if (mVar7 == 0) {
            mVar4 = 1;
          }
          else {
            pFlac->currentPCMFrame = uVar12;
            mVar8 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,mVar7);
            mVar4 = (ma_bool32)(mVar8 == mVar7);
          }
        }
        else {
          mVar4 = 0;
        }
      }
      else {
        mVar5 = ma_dr_flac__seek_flac_frame(pFlac);
        if (mVar5 != MA_SUCCESS) {
          if (mVar5 != MA_CRC_MISMATCH) goto LAB_0016e16f;
          goto LAB_0016e167;
        }
        iVar14 = 0;
        uVar12 = uVar13;
      }
    }
  }
LAB_0016e1be:
  if (mVar4 != 0) {
    pFlac->currentPCMFrame = pcmFrameIndex;
    goto LAB_0016e23a;
  }
  mVar6 = ma_dr_flac_seek_to_pcm_frame(pFlac,pcmFrameIndex_00);
  if (mVar6 != 0) goto LAB_0016e23a;
  if (!bVar1) {
    unaff_R14D = mVar4;
  }
  bVar1 = true;
  pcmFrameIndex = 0;
  goto LAB_0016dea7;
}

Assistant:

MA_API ma_bool32 ma_dr_flac_seek_to_pcm_frame(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    if (pFlac == NULL) {
        return MA_FALSE;
    }
    if (pFlac->currentPCMFrame == pcmFrameIndex) {
        return MA_TRUE;
    }
    if (pFlac->firstFLACFramePosInBytes == 0) {
        return MA_FALSE;
    }
    if (pcmFrameIndex == 0) {
        pFlac->currentPCMFrame = 0;
        return ma_dr_flac__seek_to_first_frame(pFlac);
    } else {
        ma_bool32 wasSuccessful = MA_FALSE;
        ma_uint64 originalPCMFrame = pFlac->currentPCMFrame;
        if (pcmFrameIndex > pFlac->totalPCMFrameCount) {
            pcmFrameIndex = pFlac->totalPCMFrameCount;
        }
        if (pcmFrameIndex > pFlac->currentPCMFrame) {
            ma_uint32 offset = (ma_uint32)(pcmFrameIndex - pFlac->currentPCMFrame);
            if (pFlac->currentFLACFrame.pcmFramesRemaining >  offset) {
                pFlac->currentFLACFrame.pcmFramesRemaining -= offset;
                pFlac->currentPCMFrame = pcmFrameIndex;
                return MA_TRUE;
            }
        } else {
            ma_uint32 offsetAbs = (ma_uint32)(pFlac->currentPCMFrame - pcmFrameIndex);
            ma_uint32 currentFLACFramePCMFrameCount = pFlac->currentFLACFrame.header.blockSizeInPCMFrames;
            ma_uint32 currentFLACFramePCMFramesConsumed = currentFLACFramePCMFrameCount - pFlac->currentFLACFrame.pcmFramesRemaining;
            if (currentFLACFramePCMFramesConsumed > offsetAbs) {
                pFlac->currentFLACFrame.pcmFramesRemaining += offsetAbs;
                pFlac->currentPCMFrame = pcmFrameIndex;
                return MA_TRUE;
            }
        }
#ifndef MA_DR_FLAC_NO_OGG
        if (pFlac->container == ma_dr_flac_container_ogg)
        {
            wasSuccessful = ma_dr_flac_ogg__seek_to_pcm_frame(pFlac, pcmFrameIndex);
        }
        else
#endif
        {
            if (!pFlac->_noSeekTableSeek) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__seek_table(pFlac, pcmFrameIndex);
            }
#if !defined(MA_DR_FLAC_NO_CRC)
            if (!wasSuccessful && !pFlac->_noBinarySearchSeek && pFlac->totalPCMFrameCount > 0) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__binary_search(pFlac, pcmFrameIndex);
            }
#endif
            if (!wasSuccessful && !pFlac->_noBruteForceSeek) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__brute_force(pFlac, pcmFrameIndex);
            }
        }
        if (wasSuccessful) {
            pFlac->currentPCMFrame = pcmFrameIndex;
        } else {
            if (ma_dr_flac_seek_to_pcm_frame(pFlac, originalPCMFrame) == MA_FALSE) {
                ma_dr_flac_seek_to_pcm_frame(pFlac, 0);
            }
        }
        return wasSuccessful;
    }
}